

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint lodepng::encode(vector<unsigned_char,_std::allocator<unsigned_char>_> *out,uchar *in,uint w,
                    uint h,State *state)

{
  uint uVar1;
  size_t buffersize;
  uchar *buffer;
  size_t local_28;
  uchar *local_20;
  
  uVar1 = lodepng_encode(&local_20,&local_28,in,w,h,&state->super_LodePNGState);
  if (local_20 != (uchar *)0x0) {
    std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_range_insert<unsigned_char*>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)out,
               (out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_finish,local_20,local_20 + local_28);
    free(local_20);
  }
  return uVar1;
}

Assistant:

unsigned encode(std::vector<unsigned char>& out,
    const unsigned char* in, unsigned w, unsigned h,
    State& state) {
    unsigned char* buffer;
    size_t buffersize;
    unsigned error = lodepng_encode(&buffer, &buffersize, in, w, h, &state);
    if (buffer) {
      out.insert(out.end(), &buffer[0], &buffer[buffersize]);
      lodepng_free(buffer);
    }
    return error;
  }